

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimSetFinalMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint local_54;
  uint local_50;
  int CountNot;
  int CountAll;
  int i;
  Aig_Obj_t *pFanin11;
  Aig_Obj_t *pFanin10;
  Aig_Obj_t *pFanin01;
  Aig_Obj_t *pFanin00;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  local_50 = 0;
  local_54 = 0;
  Aig_ManIncrementTravId(p0);
  for (CountNot = 0; iVar1 = Vec_PtrSize(p0->vObjs), CountNot < iVar1; CountNot = CountNot + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,CountNot);
    if ((pAVar2 != (Aig_Obj_t *)0x0) &&
       (pAVar4 = Aig_ObjRepr(p0,pAVar2), pAVar4 != (Aig_Obj_t *)0x0)) {
      local_50 = local_50 + 1;
      pAVar5 = Aig_ObjRepr(p1,pAVar4);
      if (pAVar2 != pAVar5) {
        __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                      ,0x248,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
      }
      iVar1 = Aig_ObjIsNode(pAVar2);
      if (iVar1 == 0) {
        iVar1 = Saig_ObjIsLo(p0,pAVar2);
        if (iVar1 != 0) {
          iVar1 = Saig_ObjIsLo(p1,pAVar4);
          if (iVar1 == 0) {
            __assert_fail("Saig_ObjIsLo(p1, pObj1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x259,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
          }
          pAVar5 = Saig_ObjLoToLi(p0,pAVar2);
          pAVar5 = Aig_ObjFanin0(pAVar5);
          pAVar4 = Saig_ObjLoToLi(p1,pAVar4);
          pAVar4 = Aig_ObjFanin0(pAVar4);
          pAVar5 = Aig_ObjRepr(p0,pAVar5);
          if (pAVar5 != pAVar4) {
            Aig_ObjSetTravIdCurrent(p0,pAVar2);
            local_54 = local_54 + 1;
          }
        }
      }
      else {
        iVar1 = Aig_ObjIsNode(pAVar4);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                        ,0x24b,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
        }
        pAVar5 = Aig_ObjFanin0(pAVar2);
        pObj = Aig_ObjFanin1(pAVar2);
        pAVar3 = Aig_ObjFanin0(pAVar4);
        pAVar4 = Aig_ObjFanin1(pAVar4);
        pAVar5 = Aig_ObjRepr(p0,pAVar5);
        if ((pAVar5 != pAVar3) || (pAVar5 = Aig_ObjRepr(p0,pObj), pAVar5 != pAVar4)) {
          Aig_ObjSetTravIdCurrent(p0,pAVar2);
          local_54 = local_54 + 1;
        }
      }
    }
  }
  CountNot = 0;
  do {
    iVar1 = Vec_PtrSize(p0->vObjs);
    if (iVar1 <= CountNot) {
      Abc_Print(1,"Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
                ((double)(int)local_54 * 100.0) / (double)(int)local_50,(ulong)local_50,
                (ulong)local_54);
      return;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,CountNot);
    if ((pAVar2 != (Aig_Obj_t *)0x0) &&
       (pAVar4 = Aig_ObjRepr(p0,pAVar2), pAVar4 != (Aig_Obj_t *)0x0)) {
      pAVar5 = Aig_ObjRepr(p1,pAVar4);
      if (pAVar2 != pAVar5) {
        __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                      ,0x269,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
      }
      iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar2);
      if (iVar1 != 0) {
        Aig_ObjSetRepr(p0,pAVar2,(Aig_Obj_t *)0x0);
        Aig_ObjSetRepr(p1,pAVar4,(Aig_Obj_t *)0x0);
      }
    }
    CountNot = CountNot + 1;
  } while( true );
}

Assistant:

void Saig_StrSimSetFinalMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    Aig_Obj_t * pFanin00, * pFanin01;
    Aig_Obj_t * pFanin10, * pFanin11;
    int i, CountAll = 0, CountNot = 0;
    Aig_ManIncrementTravId( p0 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        CountAll++;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsNode(pObj0) )
        {
            assert( Aig_ObjIsNode(pObj1) );
            pFanin00 = Aig_ObjFanin0(pObj0);
            pFanin01 = Aig_ObjFanin1(pObj0);
            pFanin10 = Aig_ObjFanin0(pObj1);
            pFanin11 = Aig_ObjFanin1(pObj1);
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 ||
                 Aig_ObjRepr(p0, pFanin01) != pFanin11 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
        else if ( Saig_ObjIsLo(p0, pObj0) )
        {
            assert( Saig_ObjIsLo(p1, pObj1) );
            pFanin00 = Aig_ObjFanin0( Saig_ObjLoToLi(p0, pObj0) );
            pFanin10 = Aig_ObjFanin0( Saig_ObjLoToLi(p1, pObj1) );
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
    }
    // remove irrelevant matches
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsTravIdCurrent( p0, pObj0 ) )
        {
            Aig_ObjSetRepr( p0, pObj0, NULL );
            Aig_ObjSetRepr( p1, pObj1, NULL );
        }
    }
    Abc_Print( 1, "Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
        CountAll, CountNot, 100.0*CountNot/CountAll );
}